

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O0

ssize_t mqtt_pack_connection_request
                  (uint8_t *buf,size_t bufsz,char *client_id,char *will_topic,void *will_message,
                  size_t will_message_size,char *user_name,char *password,uint8_t connect_flags,
                  uint16_t keep_alive)

{
  byte bVar1;
  size_t sVar2;
  uint8_t *puVar3;
  ssize_t sVar4;
  ssize_t sVar5;
  uint8_t *buf_00;
  uint8_t temp;
  ssize_t rv;
  uint8_t *start;
  size_t remaining_length;
  byte local_48;
  mqtt_fixed_header fixed_header;
  size_t will_message_size_local;
  void *will_message_local;
  char *will_topic_local;
  char *client_id_local;
  size_t bufsz_local;
  uint8_t *buf_local;
  
  remaining_length._4_4_ = 1;
  local_48 = local_48 & 0xf0;
  will_topic_local = client_id;
  if (client_id == (char *)0x0) {
    will_topic_local = "";
  }
  if ((*will_topic_local == '\0') && ((connect_flags & 2) == 0)) {
    return -0x7fffffe5;
  }
  fixed_header._4_8_ = will_message_size;
  sVar2 = strlen(will_topic_local);
  start._0_4_ = (int)sVar2 + MQTT_CONTROL_PINGREQ;
  if (will_topic == (char *)0x0) {
    connect_flags = connect_flags & 0xc2;
  }
  else {
    sVar2 = strlen(will_topic);
    if (will_message == (void *)0x0) {
      return -0x7ffffffa;
    }
    start._0_4_ = fixed_header._4_4_ + (int)sVar2 + 4 + (MQTTControlPacketType)start;
    bVar1 = connect_flags & 0x18;
    connect_flags = connect_flags & 0xfe | 4;
    if (bVar1 == 0x18) {
      return -0x7ffffff9;
    }
  }
  if (user_name == (char *)0x0) {
    connect_flags = connect_flags & 0x7f;
  }
  else {
    connect_flags = connect_flags | 0x80;
    sVar2 = strlen(user_name);
    start._0_4_ = (int)sVar2 + 2 + (MQTTControlPacketType)start;
  }
  if (password == (char *)0x0) {
    connect_flags = connect_flags & 0xbf;
  }
  else {
    connect_flags = connect_flags | 0x40;
    sVar2 = strlen(password);
    start._0_4_ = (int)sVar2 + 2 + (MQTTControlPacketType)start;
  }
  fixed_header.control_type = (MQTTControlPacketType)start;
  buf_local = (uint8_t *)
              mqtt_pack_fixed_header(buf,bufsz,(mqtt_fixed_header *)((long)&remaining_length + 4));
  if (0 < (long)buf_local) {
    puVar3 = buf_local + (long)buf;
    if (bufsz - (long)buf_local < (ulong)fixed_header.control_type) {
      buf_local = (uint8_t *)0x0;
    }
    else {
      *puVar3 = '\0';
      puVar3[1] = '\x04';
      puVar3[2] = 'M';
      puVar3[3] = 'Q';
      puVar3[4] = 'T';
      puVar3[5] = 'T';
      puVar3[6] = '\x04';
      buf_00 = puVar3 + 8;
      puVar3[7] = connect_flags;
      sVar4 = __mqtt_pack_uint16(buf_00,keep_alive);
      sVar5 = __mqtt_pack_str(buf_00 + sVar4,will_topic_local);
      bufsz_local = (size_t)(buf_00 + sVar4 + sVar5);
      if (will_topic != (char *)0x0) {
        sVar4 = __mqtt_pack_str((uint8_t *)bufsz_local,will_topic);
        puVar3 = (uint8_t *)(bufsz_local + sVar4);
        sVar4 = __mqtt_pack_uint16(puVar3,fixed_header._4_2_);
        memcpy(puVar3 + sVar4,will_message,fixed_header._4_8_);
        bufsz_local = (size_t)(puVar3 + sVar4 + fixed_header._4_8_);
      }
      if (user_name != (char *)0x0) {
        sVar4 = __mqtt_pack_str((uint8_t *)bufsz_local,user_name);
        bufsz_local = sVar4 + bufsz_local;
      }
      if (password != (char *)0x0) {
        sVar4 = __mqtt_pack_str((uint8_t *)bufsz_local,password);
        bufsz_local = sVar4 + bufsz_local;
      }
      buf_local = (uint8_t *)(bufsz_local - (long)buf);
    }
  }
  return (ssize_t)buf_local;
}

Assistant:

ssize_t mqtt_pack_connection_request(uint8_t* buf, size_t bufsz,
                                     const char* client_id,
                                     const char* will_topic,
                                     const void* will_message,
                                     size_t will_message_size,
                                     const char* user_name,
                                     const char* password,
                                     uint8_t connect_flags,
                                     uint16_t keep_alive)
{ 
    struct mqtt_fixed_header fixed_header;
    size_t remaining_length;
    const uint8_t *const start = buf;
    ssize_t rv;

    /* pack the fixed headr */
    fixed_header.control_type = MQTT_CONTROL_CONNECT;
    fixed_header.control_flags = 0x00;

    /* calculate remaining length and build connect_flags at the same time */
    connect_flags = (uint8_t) (connect_flags & ~MQTT_CONNECT_RESERVED);
    remaining_length = 10; /* size of variable header */

    if (client_id == NULL) {
        client_id = "";
    }
    /* For an empty client_id, a clean session is required */
    if (client_id[0] == '\0' && !(connect_flags & MQTT_CONNECT_CLEAN_SESSION)) {
        return MQTT_ERROR_CLEAN_SESSION_IS_REQUIRED;
    }
    /* mqtt_string length is strlen + 2 */
    remaining_length += __mqtt_packed_cstrlen(client_id);

    if (will_topic != NULL) {
        uint8_t temp;
        /* there is a will */
        connect_flags |= MQTT_CONNECT_WILL_FLAG;
        remaining_length += __mqtt_packed_cstrlen(will_topic);
        
        if (will_message == NULL) {
            /* if there's a will there MUST be a will message */
            return MQTT_ERROR_CONNECT_NULL_WILL_MESSAGE;
        }
        remaining_length += 2 + will_message_size; /* size of will_message */

        /* assert that the will QOS is valid (i.e. not 3) */
        temp = connect_flags & 0x18; /* mask to QOS */   
        if (temp == 0x18) {
            /* bitwise equality with QoS 3 (invalid)*/
            return MQTT_ERROR_CONNECT_FORBIDDEN_WILL_QOS;
        }
    } else {
        /* there is no will so set all will flags to zero */
        connect_flags &= (uint8_t)~MQTT_CONNECT_WILL_FLAG;
        connect_flags &= (uint8_t)~0x18;
        connect_flags &= (uint8_t)~MQTT_CONNECT_WILL_RETAIN;
    }

    if (user_name != NULL) {
        /* a user name is present */
        connect_flags |= MQTT_CONNECT_USER_NAME;
        remaining_length += __mqtt_packed_cstrlen(user_name);
    } else {
        connect_flags &= (uint8_t)~MQTT_CONNECT_USER_NAME;
    }

    if (password != NULL) {
        /* a password is present */
        connect_flags |= MQTT_CONNECT_PASSWORD;
        remaining_length += __mqtt_packed_cstrlen(password);
    } else {
        connect_flags &= (uint8_t)~MQTT_CONNECT_PASSWORD;
    }

    /* fixed header length is now calculated*/
    fixed_header.remaining_length = (uint32_t)remaining_length;

    /* pack fixed header and perform error checks */
    rv = mqtt_pack_fixed_header(buf, bufsz, &fixed_header);
    if (rv <= 0) {
        /* something went wrong */
        return rv;
    }
    buf += rv;
    bufsz -= (size_t)rv;

    /* check that the buffer has enough space to fit the remaining length */
    if (bufsz < fixed_header.remaining_length) {
        return 0;
    }

    /* pack the variable header */
    *buf++ = 0x00;
    *buf++ = 0x04;
    *buf++ = (uint8_t) 'M';
    *buf++ = (uint8_t) 'Q';
    *buf++ = (uint8_t) 'T';
    *buf++ = (uint8_t) 'T';
    *buf++ = MQTT_PROTOCOL_LEVEL;
    *buf++ = connect_flags;
    buf += __mqtt_pack_uint16(buf, keep_alive);

    /* pack the payload */
    buf += __mqtt_pack_str(buf, client_id);
    if (will_topic != NULL) {
        buf += __mqtt_pack_str(buf, will_topic);
        buf += __mqtt_pack_uint16(buf, (uint16_t)will_message_size);
        memcpy(buf, will_message, will_message_size);
        buf += will_message_size;
    }
    if (user_name != NULL) {
        buf += __mqtt_pack_str(buf, user_name);
    }
    if (password != NULL) {
        buf += __mqtt_pack_str(buf, password);
    }

    /* return the number of bytes that were consumed */
    return buf - start;
}